

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

void duckdb::BitpackingPrimitives::PackBuffer<duckdb::uhugeint_t,false>
               (data_ptr_t dst,uhugeint_t *src,idx_t count,bitpacking_width_t width)

{
  data_t *pdVar1;
  ulong in_RDX;
  long in_RSI;
  uhugeint_t tmp_buffer [32];
  idx_t i;
  idx_t misaligned_count;
  uhugeint_t *in_stack_fffffffffffffda8;
  data_ptr_t in_stack_fffffffffffffdb0;
  data_t *local_240;
  uhugeint_t local_238;
  data_t adStack_228 [496];
  data_t adStack_38 [8];
  ulong local_30;
  ulong local_28;
  ulong local_18;
  long local_10;
  
  local_28 = in_RDX & 0x1f;
  local_18 = in_RDX - local_28;
  local_10 = in_RSI;
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 0x20) {
    PackGroup<duckdb::uhugeint_t>(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,'\0');
  }
  if (local_28 != 0) {
    uhugeint_t::uhugeint_t(&local_238,0);
    pdVar1 = adStack_228;
    do {
      local_240 = pdVar1;
      memset(local_240,0,0x10);
      pdVar1 = local_240 + 0x10;
    } while (local_240 + 0x10 != adStack_38);
    memcpy(&local_238,(void *)(local_10 + local_18 * 0x10),local_28 << 4);
    PackGroup<duckdb::uhugeint_t>(local_240,in_stack_fffffffffffffda8,'\0');
  }
  return;
}

Assistant:

inline static void PackBuffer(data_ptr_t dst, T *src, idx_t count, bitpacking_width_t width) {
		if (ASSUME_INPUT_ALIGNED) {
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}
		} else {
			idx_t misaligned_count = count % BITPACKING_ALGORITHM_GROUP_SIZE;
			count -= misaligned_count;
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}

			// The input is not aligned to BITPACKING_ALGORITHM_GROUP_SIZE.
			// Copy the unaligned count into a zero-initialized temporary group, and pack it.
			if (misaligned_count) {
				T tmp_buffer[BITPACKING_ALGORITHM_GROUP_SIZE] = {0};
				memcpy(tmp_buffer, src + count, misaligned_count * sizeof(T));
				PackGroup<T>(dst + (count * width) / 8, tmp_buffer, width);
			}
		}
	}